

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O2

void __thiscall
helics::FirewallOperator::FirewallOperator
          (FirewallOperator *this,function<bool_(const_helics::Message_*)> *userCheckFunction)

{
  (this->super_FilterOperator)._vptr_FilterOperator = (_func_int **)&PTR__FirewallOperator_0044bdf8;
  std::function<bool_(const_helics::Message_*)>::function(&this->checkFunction,userCheckFunction);
  (this->operation)._M_i = drop;
  return;
}

Assistant:

FirewallOperator::FirewallOperator(std::function<bool(const Message*)> userCheckFunction):
    checkFunction(std::move(userCheckFunction))
{
}